

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O2

void cppcms::impl::string_map::insert
               (vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                *d,entry *e,int *first)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *pcVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  pointer peVar7;
  
  uVar6 = (ulong)e->hash;
  peVar7 = (d->
           super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = ((long)(d->
                          super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)peVar7) / 0x18;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar6;
    iVar5 = SUB164(auVar2 % auVar1,0);
    if (peVar7[iVar5].key == (char *)0x0) break;
    uVar6 = (SUB168(auVar2 % auVar1,0) << 0x20) + 0x100000000 >> 0x20;
  }
  peVar7 = peVar7 + iVar5;
  iVar4 = e->next_index;
  peVar7->hash = e->hash;
  peVar7->next_index = iVar4;
  pcVar3 = e->value;
  peVar7->key = e->key;
  peVar7->value = pcVar3;
  (d->
  super__Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  )._M_impl.super__Vector_impl_data._M_start[iVar5].next_index = *first;
  *first = iVar5;
  return;
}

Assistant:

static void insert(std::vector<entry> &d,entry const &e,int &first)
			{
				int pos = e.hash % d.size();
				while(d[pos].key)
					pos = (pos + 1) % d.size();
				d[pos] = e;
				d[pos].next_index = first;
				first = pos;
			}